

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMULibCal.cpp
# Opt level: O3

void processEllipsoid(void)

{
  __pid_t __pid;
  __pid_t _Var1;
  undefined8 in_RAX;
  char *__format;
  int status;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  puts("\n\nProcessing ellipsoid fit data...");
  __pid = fork();
  if (__pid == 0) {
    chdir("../RTEllipsoidFit/");
    execl("/bin/sh","/bin/sh","-c","octave RTEllipsoidFit.m",0);
    printf("here");
    _exit(1);
  }
  if (-1 < __pid) {
    _Var1 = waitpid(__pid,&local_14,0);
    if (_Var1 == __pid) {
      if (local_14 == 0) {
        printf("\nEllipsoid fit completed - saving data to file.");
        RTIMUMagCal::magCalSaveCorr((char *)magCal);
        return;
      }
      __format = "\nEllipsoid fit returned %d - aborting.\n";
    }
    else {
      __format = "\n\nEllipsoid fit failed, %d\n";
    }
    printf(__format);
    return;
  }
  puts("\nFailed to start ellipsoid fitting code.");
  return;
}

Assistant:

void processEllipsoid()
{
    pid_t pid;
    int status;

    printf("\n\nProcessing ellipsoid fit data...\n");

    pid = fork();
    if (pid == 0) {
        //  child process
        chdir(ELLIPSOID_FIT_DIR);
        execl("/bin/sh", "/bin/sh", "-c", RTIMUCALDEFS_OCTAVE_COMMAND, NULL);
        printf("here");
        _exit(EXIT_FAILURE);
    } else if (pid < 0) {
        printf("\nFailed to start ellipsoid fitting code.\n");
        return;
    } else {
        //  parent process - wait for child
        if (waitpid(pid, &status, 0) != pid) {
            printf("\n\nEllipsoid fit failed, %d\n", status);
        } else {
            if (status == 0) {
                printf("\nEllipsoid fit completed - saving data to file.");
                magCal->magCalSaveCorr(ELLIPSOID_FIT_DIR);
            } else {
                printf("\nEllipsoid fit returned %d - aborting.\n", status);
            }
        }
    }
}